

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O0

Aig_Man_t * generateDisjunctiveTester(Abc_Ntk_t *pNtk,Aig_Man_t *pAig,int combN,int combK)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Aig_Man_t *p_00;
  size_t sVar3;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Obj_t *p1;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Vec_Int_t *vCandidateMonotoneSignals;
  Vec_Ptr_t *vDisj_nCk;
  Vec_Ptr_t *vPODriver_nCk;
  Vec_Ptr_t *vLO_nCk;
  Aig_Obj_t *pObjDisj_nCk;
  Aig_Obj_t *pObjLO_nCk;
  Aig_Obj_t *pObj;
  long lCombinationCount;
  long longI;
  int combK_internal;
  int combN_internal;
  int hintSingalEndMarker;
  int hintSingalBeginningMarker;
  int nRegCount;
  int i;
  int poCopied;
  int liCreated;
  int liCopied;
  int loCreated;
  int loCopied;
  int piCopied;
  Aig_Man_t *pNewAig;
  int combK_local;
  int combN_local;
  Aig_Man_t *pAig_local;
  Abc_Ntk_t *pNtk_local;
  
  liCopied = 0;
  liCreated = 0;
  poCopied = 0;
  i = 0;
  p = findHintOutputs(pNtk);
  if (p == (Vec_Int_t *)0x0) {
    printf("\nTraget Signal Set is Empty: Duplicating given AIG\n");
    longI._4_4_ = 0;
  }
  else {
    iVar1 = Vec_IntEntry(p,0);
    iVar2 = Vec_IntSize(p);
    iVar2 = Vec_IntEntry(p,iVar2 + -1);
    longI._4_4_ = (iVar2 - iVar1) + 1;
  }
  iVar1 = Aig_ManObjNumMax(pAig);
  p_00 = Aig_ManStart(iVar1);
  sVar3 = strlen(pAig->pName);
  pcVar4 = (char *)malloc(sVar3 + 5);
  p_00->pName = pcVar4;
  sprintf(p_00->pName,"%s_%s",pAig->pName,"nCk");
  p_00->pSpec = (char *)0x0;
  pAVar5 = Aig_ManConst1(pAig);
  pAVar6 = Aig_ManConst1(p_00);
  (pAVar5->field_5).pData = pAVar6;
  for (hintSingalBeginningMarker = 0; iVar1 = Saig_ManPiNum(pAig), hintSingalBeginningMarker < iVar1
      ; hintSingalBeginningMarker = hintSingalBeginningMarker + 1) {
    pvVar7 = Vec_PtrEntry(pAig->vCis,hintSingalBeginningMarker);
    pAVar5 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  for (hintSingalBeginningMarker = 0; iVar1 = Saig_ManRegNum(pAig),
      hintSingalBeginningMarker < iVar1; hintSingalBeginningMarker = hintSingalBeginningMarker + 1)
  {
    pVVar9 = pAig->vCis;
    iVar1 = Saig_ManPiNum(pAig);
    pvVar7 = Vec_PtrEntry(pVVar9,hintSingalBeginningMarker + iVar1);
    liCopied = liCopied + 1;
    pAVar5 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  pObj = (Aig_Obj_t *)0x0;
  for (longI._0_4_ = 1; (int)longI <= combK; longI._0_4_ = (int)longI + 1) {
    lVar8 = countCombination((long)longI._4_4_,(long)(int)longI);
    pObj = (Aig_Obj_t *)((long)&pObj->field_0 + lVar8);
  }
  if ((long)pObj < 1) {
    __assert_fail("lCombinationCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/combination.c"
                  ,0xde,"Aig_Man_t *generateDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int, int)");
  }
  iVar1 = (int)pObj;
  pVVar9 = Vec_PtrAlloc(iVar1);
  for (lCombinationCount = 0; lCombinationCount < (long)pObj;
      lCombinationCount = lCombinationCount + 1) {
    liCreated = liCreated + 1;
    pAVar5 = Aig_ObjCreateCi(p_00);
    Vec_PtrPush(pVVar9,pAVar5);
  }
  for (hintSingalBeginningMarker = 0; iVar2 = Vec_PtrSize(pAig->vObjs),
      hintSingalBeginningMarker < iVar2; hintSingalBeginningMarker = hintSingalBeginningMarker + 1)
  {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,hintSingalBeginningMarker);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0)) {
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      p1 = Aig_ObjChild1Copy(pAVar5);
      pAVar6 = Aig_And(p_00,pAVar6,p1);
      (pAVar5->field_5).pData = pAVar6;
    }
  }
  p_01 = Vec_PtrAlloc(iVar1);
  for (longI._0_4_ = 1; (int)longI <= combK; longI._0_4_ = (int)longI + 1) {
    generateCombinatorialStabil(p_00,pAig,p,p_01,longI._4_4_,(int)longI);
  }
  p_02 = Vec_PtrAlloc(iVar1);
  for (lCombinationCount = 0; lCombinationCount < (long)pObj;
      lCombinationCount = lCombinationCount + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar9,(int)lCombinationCount);
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_01,(int)lCombinationCount);
    pAVar6 = Aig_Not(pAVar6);
    pAVar5 = Aig_Or(p_00,pAVar6,pAVar5);
    Vec_PtrPush(p_02,pAVar5);
  }
  for (hintSingalBeginningMarker = 0; iVar1 = Saig_ManPoNum(pAig), hintSingalBeginningMarker < iVar1
      ; hintSingalBeginningMarker = hintSingalBeginningMarker + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,hintSingalBeginningMarker);
    pAVar6 = Aig_ObjChild0Copy(pAVar5);
    pAVar6 = Aig_ObjCreateCo(p_00,pAVar6);
    (pAVar5->field_5).pData = pAVar6;
  }
  for (lCombinationCount = 0; lCombinationCount < (long)pObj;
      lCombinationCount = lCombinationCount + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_02,(int)lCombinationCount);
    Aig_ObjCreateCo(p_00,pAVar5);
  }
  for (hintSingalBeginningMarker = 0; iVar1 = Saig_ManRegNum(pAig),
      hintSingalBeginningMarker < iVar1; hintSingalBeginningMarker = hintSingalBeginningMarker + 1)
  {
    pVVar9 = pAig->vCos;
    iVar1 = Saig_ManPoNum(pAig);
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar9,hintSingalBeginningMarker + iVar1);
    poCopied = poCopied + 1;
    pAVar5 = Aig_ObjChild0Copy(pAVar5);
    Aig_ObjCreateCo(p_00,pAVar5);
  }
  for (lCombinationCount = 0; lCombinationCount < (long)pObj;
      lCombinationCount = lCombinationCount + 1) {
    i = i + 1;
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_02,(int)lCombinationCount);
    Aig_ObjCreateCo(p_00,pAVar5);
  }
  if (poCopied + i == liCopied + liCreated) {
    Aig_ManSetRegNum(p_00,liCopied + liCreated);
    Aig_ManCleanup(p_00);
    iVar1 = Aig_ManCheck(p_00);
    if (iVar1 != 0) {
      return p_00;
    }
    __assert_fail("Aig_ManCheck( pNewAig )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/combination.c"
                  ,0x13b,"Aig_Man_t *generateDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int, int)")
    ;
  }
  __assert_fail("liCopied + liCreated == loCopied + loCreated",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/combination.c"
                ,0x136,"Aig_Man_t *generateDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int, int)");
}

Assistant:

Aig_Man_t *generateDisjunctiveTester( Abc_Ntk_t *pNtk, Aig_Man_t *pAig, int combN, int combK )
{
	//AIG creation related data structure
	Aig_Man_t *pNewAig;
	int piCopied = 0, loCopied = 0, loCreated = 0, liCopied = 0, liCreated = 0, poCopied = 0;
	//int i, iElem, nRegCount, hintSingalBeginningMarker, hintSingalEndMarker;
	int i, nRegCount, hintSingalBeginningMarker, hintSingalEndMarker;
	int combN_internal, combK_internal; //, targetPoIndex;
	long longI, lCombinationCount;
	//Aig_Obj_t *pObj, *pObjMonoCand, *pObjLO_nCk, *pObjDisj_nCk;
	Aig_Obj_t *pObj, *pObjLO_nCk, *pObjDisj_nCk;
	Vec_Ptr_t *vLO_nCk, *vPODriver_nCk, *vDisj_nCk;
	Vec_Int_t *vCandidateMonotoneSignals;

	extern Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk);
	
	//Knuth's Data Strcuture
	//Vec_Int_t *vC_KNUTH;
	//int i_KNUTH, j_KNUTH, combCounter_KNUTH = 0;

	//Collecting target HINT signals
	vCandidateMonotoneSignals = findHintOutputs(pNtk);
	if( vCandidateMonotoneSignals == NULL )
	{
		printf("\nTraget Signal Set is Empty: Duplicating given AIG\n");
		combN_internal = 0;
	}
	else
	{
		//Vec_IntForEachEntry( vCandidateMonotoneSignals, iElem, i )
		//	printf("Po[%d] = %s\n", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ) );
		hintSingalBeginningMarker = Vec_IntEntry( vCandidateMonotoneSignals, 0 );
		hintSingalEndMarker = Vec_IntEntry( vCandidateMonotoneSignals, Vec_IntSize(vCandidateMonotoneSignals) - 1 );
		combN_internal = hintSingalEndMarker - hintSingalBeginningMarker + 1;
	}

	//combK_internal = combK;

	//Knuth's Data Structure Initialization
	//vC_KNUTH = Vec_IntAlloc(combK_internal+3);
	//for(i_KNUTH=-1; i_KNUTH<combK_internal; i_KNUTH++)
	//	Vec_IntPush( vC_KNUTH, i_KNUTH );
	//Vec_IntPush( vC_KNUTH, combN_internal );
	//Vec_IntPush( vC_KNUTH, 0 );

	//Standard AIG duplication begins
	//Standard AIG Manager Creation
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_nCk") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "nCk");
    	pNewAig->pSpec = NULL;

	//Standard Mapping of Constant Nodes
	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//Standard AIG PI duplication
	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//Standard AIG LO duplication
	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//nCk LO creation
	lCombinationCount = 0;
	for(combK_internal=1; combK_internal<=combK; combK_internal++)
		lCombinationCount += countCombination( combN_internal, combK_internal );
	assert( lCombinationCount > 0 );
	vLO_nCk = Vec_PtrAlloc(lCombinationCount);
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		loCreated++;
		pObj = Aig_ObjCreateCi(pNewAig);
		Vec_PtrPush( vLO_nCk, pObj );
	}

	//Standard Node duplication
	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//nCk specific logic creation (i.e. nCk number of OR gates)
	vDisj_nCk = Vec_PtrAlloc(lCombinationCount);

	

	//while(1)
	//{
	//	//visit combination
	//	//printf("Comb-%3d : ", ++combCounter_KNUTH);
	//	pObjMonoCand = Aig_Not(Aig_ManConst1(pNewAig));
	//	for( i_KNUTH=combK_internal; i_KNUTH>0; i_KNUTH--)
	//	{
	//		//printf("vC[%d] = %d ", i_KNUTH, Vec_IntEntry(vC_KNUTH, i_KNUTH));
	//		targetPoIndex = Vec_IntEntry( vCandidateMonotoneSignals, Vec_IntEntry(vC_KNUTH, i_KNUTH));
	//		pObj = Aig_ObjChild0Copy(Aig_ManCo( pAig, targetPoIndex ));
	//		pObjMonoCand = Aig_Or( pNewAig, pObj, pObjMonoCand );
	//	}
	//	Vec_PtrPush(vDisj_nCk, pObjMonoCand );
	//	//printf("\n");

	//	j_KNUTH = 1;
	//	while( Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 == Vec_IntEntry( vC_KNUTH, j_KNUTH+1 ) )
	//	{
	//		Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, j_KNUTH-1 );
	//		j_KNUTH = j_KNUTH + 1;
	//	}
	//	if( j_KNUTH > combK_internal ) break;
	//	Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 );
	//}
	for( combK_internal=1; combK_internal<=combK; combK_internal++ )
		generateCombinatorialStabil( pNewAig, pAig, vCandidateMonotoneSignals,
				vDisj_nCk, combN_internal, combK_internal );


	//creation of implication logic
	vPODriver_nCk = Vec_PtrAlloc(lCombinationCount);
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		pObjLO_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vLO_nCk, longI ));
		pObjDisj_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vDisj_nCk, longI ));

		pObj = Aig_Or( pNewAig, Aig_Not(pObjDisj_nCk), pObjLO_nCk);
		Vec_PtrPush(vPODriver_nCk, pObj);
	}
	
	//Standard PO duplication
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	//nCk specific PO creation
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
	}

	//Standard LI duplication
	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	//nCk specific LI creation
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
	}

	//clean-up, book-keeping
	assert( liCopied + liCreated == loCopied + loCreated );	
	nRegCount = loCopied + loCreated;

	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	assert( Aig_ManCheck( pNewAig ) );
	
	//Vec_IntFree(vC_KNUTH);	
	return pNewAig;
}